

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topojson.cc
# Opt level: O0

void __thiscall topojson_t::make_coordinates(topojson_t *this,size_t topology_index)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  pointer pdVar4;
  reference pvVar5;
  size_type sVar6;
  uint *puVar7;
  reference pvVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  size_type sVar12;
  uint local_194;
  size_t jdx_1;
  size_t idx_2;
  size_t jdx;
  size_t idx_1;
  double position [2];
  size_type local_140;
  size_t idx;
  vector<double,_std::allocator<double>_> yp;
  vector<double,_std::allocator<double>_> xp;
  double y;
  double x;
  size_t size_vec_arcs;
  arc_t arc;
  int index_q;
  int index;
  size_t idx_arc;
  size_t size_arcs;
  undefined1 local_b0 [8];
  Polygon_topojson_t polygon;
  size_t idx_pol;
  size_t size_pol;
  Geometry_t geometry;
  size_t size_geom;
  size_t topology_index_local;
  topojson_t *this_local;
  
  pvVar2 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                     (&this->m_topology,topology_index);
  geometry.m_polygon.super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<Geometry_t,_std::allocator<Geometry_t>_>::size(&pvVar2->m_geom);
  this->idx_geom = 0;
  do {
    if (geometry.m_polygon.
        super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage <= (pointer)this->idx_geom) {
      return;
    }
    pvVar2 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                       (&this->m_topology,topology_index);
    pvVar3 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at
                       (&pvVar2->m_geom,this->idx_geom);
    Geometry_t::Geometry_t((Geometry_t *)&size_pol,pvVar3);
    iVar1 = std::__cxx11::string::compare((char *)&size_pol);
    if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)&size_pol), iVar1 == 0)) {
      pdVar4 = (pointer)std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::size
                                  ((vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                    *)((long)&geometry.type.field_2 + 8));
      for (polygon.m_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          polygon.m_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage < pdVar4;
          polygon.m_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)polygon.m_y.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
        pvVar5 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                           ((vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_> *)
                            ((long)&geometry.type.field_2 + 8),
                            (size_type)
                            polygon.m_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        Polygon_topojson_t::Polygon_topojson_t((Polygon_topojson_t *)local_b0,pvVar5);
        sVar6 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_b0);
        for (_index_q = 0; _index_q < sVar6; _index_q = _index_q + 1) {
          puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::at
                                     ((vector<int,_std::allocator<int>_> *)local_b0,_index_q);
          arc.vec.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = *puVar7;
          local_194 = arc.vec.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          if ((int)arc.vec.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 0) {
            local_194 = arc.vec.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ^ 0xffffffff;
          }
          arc.vec.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_194;
          pvVar8 = std::vector<arc_t,_std::allocator<arc_t>_>::at
                             (&this->m_arcs,(long)(int)local_194);
          arc_t::arc_t((arc_t *)&size_vec_arcs,pvVar8);
          sVar9 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)&size_vec_arcs);
          y = 0.0;
          xp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)
                     &yp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&idx);
          for (local_140 = 0; local_140 < sVar9; local_140 = local_140 + 1) {
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)&size_vec_arcs,local_140);
            pvVar11 = std::vector<double,_std::allocator<double>_>::at(pvVar10,0);
            idx_1 = (size_t)*pvVar11;
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)&size_vec_arcs,local_140);
            pvVar11 = std::vector<double,_std::allocator<double>_>::at(pvVar10,1);
            y = y + (double)idx_1;
            idx_1 = (size_t)(y * this->scale[0] + this->translate[0]);
            xp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage =
                 (pointer)((double)xp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + *pvVar11);
            position[0] = (double)xp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage * this->scale[1] +
                          this->translate[1];
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)
                       &yp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(value_type_conflict2 *)&idx_1);
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)&idx,position);
          }
          if ((int)arc.vec.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 0) {
            for (jdx = 0; jdx < sVar9; jdx = jdx + 1) {
              pvVar2 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                                 (&this->m_topology,topology_index);
              pvVar3 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at
                                 (&pvVar2->m_geom,this->idx_geom);
              pvVar5 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 (&pvVar3->m_polygon,
                                  (size_type)
                                  polygon.m_y.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   &yp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,~jdx + sVar9);
              std::vector<double,_std::allocator<double>_>::push_back(&pvVar5->m_x,pvVar11);
              pvVar2 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                                 (&this->m_topology,topology_index);
              pvVar3 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at
                                 (&pvVar2->m_geom,this->idx_geom);
              pvVar5 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 (&pvVar3->m_polygon,
                                  (size_type)
                                  polygon.m_y.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)&idx,~jdx + sVar9);
              std::vector<double,_std::allocator<double>_>::push_back(&pvVar5->m_y,pvVar11);
            }
          }
          else {
            for (jdx_1 = 0; jdx_1 < sVar9; jdx_1 = jdx_1 + 1) {
              pvVar2 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                                 (&this->m_topology,topology_index);
              pvVar3 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at
                                 (&pvVar2->m_geom,this->idx_geom);
              pvVar5 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 (&pvVar3->m_polygon,
                                  (size_type)
                                  polygon.m_y.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   &yp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,jdx_1);
              std::vector<double,_std::allocator<double>_>::push_back(&pvVar5->m_x,pvVar11);
              pvVar2 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                                 (&this->m_topology,topology_index);
              pvVar3 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at
                                 (&pvVar2->m_geom,this->idx_geom);
              pvVar5 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 (&pvVar3->m_polygon,
                                  (size_type)
                                  polygon.m_y.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)&idx,jdx_1);
              std::vector<double,_std::allocator<double>_>::push_back(&pvVar5->m_y,pvVar11);
            }
          }
          sVar12 = std::vector<double,_std::allocator<double>_>::size
                             ((vector<double,_std::allocator<double>_> *)
                              &yp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          if (sVar12 != sVar9) {
            __assert_fail("xp.size() == size_vec_arcs",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/pedro-vicente[P]lib_topojson/topojson.cc"
                          ,0x1fe,"void topojson_t::make_coordinates(size_t)");
          }
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)&idx);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)
                     &yp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          arc_t::~arc_t((arc_t *)&size_vec_arcs);
        }
        Polygon_topojson_t::~Polygon_topojson_t((Polygon_topojson_t *)local_b0);
      }
    }
    Geometry_t::~Geometry_t((Geometry_t *)&size_pol);
    this->idx_geom = this->idx_geom + 1;
  } while( true );
}

Assistant:

void topojson_t::make_coordinates(size_t topology_index)
{
  size_t size_geom = m_topology.at(topology_index).m_geom.size();
  for (idx_geom = 0; idx_geom < size_geom; idx_geom++)
  {
    Geometry_t geometry = m_topology.at(topology_index).m_geom.at(idx_geom);
    if (geometry.type.compare("Polygon") == 0 || geometry.type.compare("MultiPolygon") == 0)
    {
      size_t size_pol = geometry.m_polygon.size();
      for (size_t idx_pol = 0; idx_pol < size_pol; idx_pol++)
      {
        Polygon_topojson_t polygon = geometry.m_polygon.at(idx_pol);
        size_t size_arcs = polygon.arcs.size();

        for (size_t idx_arc = 0; idx_arc < size_arcs; idx_arc++)
        {
          int index = polygon.arcs.at(idx_arc);
          int index_q = index < 0 ? ~index : index;
          arc_t arc = m_arcs.at(index_q);
          size_t size_vec_arcs = arc.vec.size();
          //if a topology is quantized, the positions of each arc in the topology which are quantized 
          //must be delta-encoded. The first position of the arc is a normal position [x1, y1]. 
          //The second position [x2, y2] is encoded as [dx2, dy2], where 
          //x2 = x1 + dx2 and 
          //y2 = y1 + dx2.
          //The third position [x3, y3] is encoded as [dx3, dy3], where 
          //x3 = x2 + dx3 = x1 + dx2 + dx3 and
          //y3 = y2 + dy3 = y1 + dy2 + dy3 and so on.
          double x = 0;
          double y = 0;
          //temporary positions
          std::vector<double> xp;
          std::vector<double> yp;
          for (size_t idx = 0; idx < size_vec_arcs; idx++)
          {
            double position[2];
            position[0] = arc.vec.at(idx).at(0);
            position[1] = arc.vec.at(idx).at(1);
            position[0] = (x += position[0]) * scale[0] + translate[0];
            position[1] = (y += position[1]) * scale[1] + translate[1];
            xp.push_back(position[0]);
            yp.push_back(position[1]);
          }//size_vec_arcs

          //@mbostock
          //TopoJSON allows you to reference a reversed arc in a geometry so that when geometries share an arc, 
          //but some geometries need the arc in the opposite direction, the geometries can reference the same arc.
          //This occurs very commonly when you have neighboring geometries.For example, California and Nevada 
          //share a border, but given that both would typically have the same winding order, 
          //the shared border must be reversed between the two polygons if you want to share the arc.
          //A reversed arc means that rather than the arc�s points going p_0, p_1, � p_n, 
          //the points go p_n, p_{ n - 1 }, � p_0.

           //reverse the subsequences of points represented by the negative arc indexes
          if (index < 0)
          {
            for (size_t idx = 0; idx < size_vec_arcs; idx++)
            {
              size_t jdx = size_vec_arcs - idx - 1;
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_x.push_back(xp[jdx]);
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_y.push_back(yp[jdx]);
            }
          }
          //do not reverse
          else
          {
            for (size_t idx = 0; idx < size_vec_arcs; idx++)
            {
              size_t jdx = idx;
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_x.push_back(xp[jdx]);
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_y.push_back(yp[jdx]);
            }
          }
          assert(xp.size() == size_vec_arcs);

        }//size_arcs
      }//size_pol
    }//"Polygon"
  }//size_geom
}